

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::mouseReleaseEvent(QListView *this,QMouseEvent *e)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  int iVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect local_38;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemView::mouseReleaseEvent((QAbstractItemView *)this,e);
  if (((this_00->showElasticBand == true) &&
      ((this_00->elasticBand).x1.m_i <= (this_00->elasticBand).x2.m_i)) &&
     ((this_00->elasticBand).y1.m_i <= (this_00->elasticBand).y2.m_i)) {
    pQVar2 = QWidget::style((QWidget *)this);
    iVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,5,0,0);
    local_28.x1.m_i = (this_00->elasticBand).x1.m_i + iVar1 * -2;
    local_28.x2.m_i = (this_00->elasticBand).x2.m_i + iVar1 * 2;
    local_28.y1.m_i = (this_00->elasticBand).y1.m_i + iVar1 * -2;
    local_28.y2.m_i = iVar1 * 2 + (this_00->elasticBand).y2.m_i;
    this_01 = (this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
    local_38 = QListViewPrivate::mapToViewport(this_00,&local_28,true);
    QWidget::update(this_01,&local_38);
    (this_00->elasticBand).x1 = 0;
    (this_00->elasticBand).y1 = 0;
    (this_00->elasticBand).x2 = -1;
    (this_00->elasticBand).y2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QListView);
    QAbstractItemView::mouseReleaseEvent(e);
    // #### move this implementation into a dynamic class
    if (d->showElasticBand && d->elasticBand.isValid()) {
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = d->elasticBand.adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = QRect();
    }
}